

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_rset(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  short sVar2;
  CHAR_DATA *ch_00;
  ROOM_INDEX_DATA *pRoomIndex;
  char *in_RSI;
  long in_RDI;
  int value;
  ROOM_INDEX_DATA *location;
  char arg3 [4608];
  char arg2 [4608];
  char arg1 [4608];
  undefined4 in_stack_ffffffffffffc9d8;
  undefined4 in_stack_ffffffffffffc9dc;
  char *in_stack_ffffffffffffc9e0;
  char in_stack_ffffffffffffc9e8;
  undefined7 in_stack_ffffffffffffc9e9;
  char *in_stack_ffffffffffffc9f0;
  char *in_stack_ffffffffffffca00;
  char *in_stack_ffffffffffffca08;
  char local_2418;
  char local_1218;
  char *in_stack_ffffffffffffffe8;
  int iVar3;
  
  smash_tilde(in_RSI);
  one_argument(in_stack_ffffffffffffc9e0,
               (char *)CONCAT44(in_stack_ffffffffffffc9dc,in_stack_ffffffffffffc9d8));
  ch_00 = (CHAR_DATA *)
          one_argument(in_stack_ffffffffffffc9e0,
                       (char *)CONCAT44(in_stack_ffffffffffffc9dc,in_stack_ffffffffffffc9d8));
  strcpy(&stack0xffffffffffffc9e8,(char *)ch_00);
  if (((local_1218 == '\0') || (local_2418 == '\0')) || (in_stack_ffffffffffffc9e8 == '\0')) {
    send_to_char(in_stack_ffffffffffffc9f0,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc9e9,in_stack_ffffffffffffc9e8));
    send_to_char(in_stack_ffffffffffffc9f0,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc9e9,in_stack_ffffffffffffc9e8));
    send_to_char(in_stack_ffffffffffffc9f0,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc9e9,in_stack_ffffffffffffc9e8));
    send_to_char(in_stack_ffffffffffffc9f0,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc9e9,in_stack_ffffffffffffc9e8));
  }
  else {
    pRoomIndex = find_location((CHAR_DATA *)
                               CONCAT71(in_stack_ffffffffffffc9e9,in_stack_ffffffffffffc9e8),
                               in_stack_ffffffffffffc9e0);
    if (pRoomIndex == (ROOM_INDEX_DATA *)0x0) {
      send_to_char(in_stack_ffffffffffffc9f0,
                   (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc9e9,in_stack_ffffffffffffc9e8));
    }
    else {
      bVar1 = is_room_owner((CHAR_DATA *)
                            CONCAT44(in_stack_ffffffffffffc9dc,in_stack_ffffffffffffc9d8),
                            (ROOM_INDEX_DATA *)0x598416);
      if (((bVar1) || (*(ROOM_INDEX_DATA **)(in_RDI + 0xa8) == pRoomIndex)) ||
         ((bVar1 = room_is_private(pRoomIndex), !bVar1 ||
          (bVar1 = is_trusted((CHAR_DATA *)
                              CONCAT44(in_stack_ffffffffffffc9dc,in_stack_ffffffffffffc9d8),0),
          bVar1)))) {
        bVar1 = is_number((char *)CONCAT44(in_stack_ffffffffffffc9dc,in_stack_ffffffffffffc9d8));
        if (bVar1) {
          iVar3 = atoi(&stack0xffffffffffffc9e8);
          sVar2 = (short)iVar3;
          bVar1 = str_prefix(in_stack_ffffffffffffca08,in_stack_ffffffffffffca00);
          if (bVar1) {
            do_rset(ch_00,in_stack_ffffffffffffffe8);
          }
          else {
            pRoomIndex->sector_type = sVar2;
          }
        }
        else {
          send_to_char(in_stack_ffffffffffffc9f0,
                       (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc9e9,in_stack_ffffffffffffc9e8));
        }
      }
      else {
        send_to_char(in_stack_ffffffffffffc9f0,
                     (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc9e9,in_stack_ffffffffffffc9e8));
      }
    }
  }
  return;
}

Assistant:

void do_rset(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	char arg3[MAX_INPUT_LENGTH];
	ROOM_INDEX_DATA *location;
	int value;

	smash_tilde(argument);
	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);
	strcpy(arg3, argument);

	if (arg1[0] == '\0' || arg2[0] == '\0' || arg3[0] == '\0')
	{
		send_to_char("Syntax:\n\r", ch);
		send_to_char("  set room <location> <field> <value>\n\r", ch);
		send_to_char("  Field being one of:\n\r", ch);
		send_to_char("    flags sector\n\r", ch);
		return;
	}

	location = find_location(ch, arg1);

	if (location == nullptr)
	{
		send_to_char("No such location.\n\r", ch);
		return;
	}

	if (!is_room_owner(ch, location) && ch->in_room != location && room_is_private(location) &&
		!is_trusted(ch, IMPLEMENTOR))
	{
		send_to_char("That room is private right now.\n\r", ch);
		return;
	}

	/*
	 * Snarf the value.
	 */
	if (!is_number(arg3))
	{
		send_to_char("Value must be numeric.\n\r", ch);
		return;
	}

	value = atoi(arg3);

	/*
	 * Set something.
	 */

	if (!str_prefix(arg2, "sector"))
	{
		location->sector_type = value;
		return;
	}

	/*
	 * Generate usage message.
	 */
	do_rset(ch, "");
}